

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  ulong uVar1;
  cmListFileBacktrace *pcVar2;
  cmListFileBacktrace local_58;
  undefined1 local_48 [8];
  cmGeneratorExpression ge;
  allocator<char> local_21;
  string *local_20;
  string *depfile;
  cmCustomCommandGenerator *this_local;
  
  depfile = (string *)this;
  this_local = (cmCustomCommandGenerator *)__return_storage_ptr__;
  local_20 = cmCustomCommand::GetDepfile_abi_cxx11_(this->CC);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = cmCustomCommand::GetBacktrace(this->CC);
    cmListFileBacktrace::cmListFileBacktrace(&local_58,pcVar2);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_48,&local_58);
    cmListFileBacktrace::~cmListFileBacktrace(&local_58);
    anon_unknown.dwarf_bbcdc9::EvaluateDepfile
              (__return_storage_ptr__,local_20,(cmGeneratorExpression *)local_48,this->LG,
               &this->OutputConfig);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetDepfile() const
{
  const auto& depfile = this->CC->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  cmGeneratorExpression ge(this->CC->GetBacktrace());
  return EvaluateDepfile(depfile, ge, this->LG, this->OutputConfig);
}